

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksToSubprojects
          (cmExtraEclipseCDT4Generator *this,cmGeneratedFileStream *fout,string *baseDir)

{
  bool bVar1;
  cmGlobalGenerator *pcVar2;
  char *pcVar3;
  _Base_ptr p_Var4;
  allocator local_99;
  cmGeneratedFileStream *local_98;
  string linkName;
  string linkSourceDirectory;
  string local_50;
  
  if (this->GenerateLinkedResources == true) {
    local_98 = fout;
    std::__cxx11::string::string
              ((string *)&linkSourceDirectory,"[Subprojects]",(allocator *)&local_50);
    std::__cxx11::string::string((string *)&linkName,"virtual:/virtual",&local_99);
    AppendLinkedResource(local_98,&linkSourceDirectory,&linkName,VirtualFolder);
    std::__cxx11::string::~string((string *)&linkName);
    std::__cxx11::string::~string((string *)&linkSourceDirectory);
    pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    p_Var4 = (pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var4 != &(pcVar2->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
      pcVar3 = cmMakefile::GetCurrentSourceDirectory
                         (*(cmMakefile **)(**(long **)(p_Var4 + 2) + 0x28));
      std::__cxx11::string::string((string *)&linkName,pcVar3,(allocator *)&local_50);
      std::__cxx11::string::string((string *)&linkSourceDirectory,(string *)&linkName);
      std::__cxx11::string::~string((string *)&linkName);
      bVar1 = std::operator!=(baseDir,&linkSourceDirectory);
      if (bVar1) {
        bVar1 = cmsys::SystemTools::IsSubDirectory(baseDir,&linkSourceDirectory);
        if (!bVar1) {
          std::__cxx11::string::string((string *)&linkName,"[Subprojects]/",(allocator *)&local_50);
          std::__cxx11::string::append((string *)&linkName);
          std::__cxx11::string::string((string *)&local_50,(string *)&linkSourceDirectory);
          AppendLinkedResource(local_98,&linkName,&local_50,LinkToFolder);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&linkName);
        }
      }
      std::__cxx11::string::~string((string *)&linkSourceDirectory);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    }
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksToSubprojects(
                       cmGeneratedFileStream& fout, const std::string& baseDir)
{
  if (!this->GenerateLinkedResources)
    {
    return;
    }

  // for each sub project create a linked resource to the source dir
  // - only if it is an out-of-source build
  this->AppendLinkedResource(fout, "[Subprojects]",
                             "virtual:/virtual", VirtualFolder);

  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
       it != this->GlobalGenerator->GetProjectMap().end();
       ++it)
    {
    std::string linkSourceDirectory = this->GetEclipsePath(
                   it->second[0]->GetMakefile()->GetCurrentSourceDirectory());
    // a linked resource must not point to a parent directory of .project or
    // .project itself
    if ((baseDir != linkSourceDirectory) &&
        !cmSystemTools::IsSubDirectory(baseDir,
                                       linkSourceDirectory))
      {
      std::string linkName = "[Subprojects]/";
      linkName += it->first;
      this->AppendLinkedResource(fout, linkName,
                                 this->GetEclipsePath(linkSourceDirectory),
                                 LinkToFolder
                                );
      // Don't add it to the srcLinkedResources, because listing multiple
      // directories confuses the Eclipse indexer (#13596).
      }
    }
}